

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O3

void __thiscall util_tests::util_ReadBinaryFile::test_method(util_ReadBinaryFile *this)

{
  long lVar1;
  int iVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  bool bVar5;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  check_type cVar6;
  char *local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  assertion_result local_408;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_398;
  assertion_result local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_370;
  _Alloc_hider *local_368;
  char *local_360;
  assertion_result local_358;
  undefined1 local_340 [8];
  bool local_338;
  undefined7 uStack_337;
  undefined1 *local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  path local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  ofstream file;
  undefined1 local_2c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8 [14];
  ios_base local_1d8 [264];
  string expected_text;
  path local_b0;
  path tmpfile;
  path tmpfolder;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDir
            ((path *)&tmpfolder.super_path,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args,false)
  ;
  std::filesystem::__cxx11::path::path(&local_b0,&tmpfolder.super_path);
  std::filesystem::__cxx11::path::_M_append(&local_b0,0xf,"read_binary.dat");
  std::filesystem::__cxx11::path::path(&tmpfile.super_path,&local_b0);
  std::filesystem::__cxx11::path::~path(&local_b0);
  expected_text._M_dataplus._M_p = (pointer)&expected_text.field_2;
  expected_text._M_string_length = 0;
  expected_text.field_2._M_local_buf[0] = '\0';
  iVar2 = 0x1e;
  do {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&expected_text,"0123456789");
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  std::ofstream::ofstream(&file,tmpfile.super_path._M_pathname._M_dataplus._M_p,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&file,expected_text._M_dataplus._M_p,expected_text._M_string_length);
  _file = _VTT;
  *(undefined8 *)(&file + *(long *)(_VTT + -0x18)) = _vtable;
  std::filebuf::~filebuf((filebuf *)local_2c8);
  std::ios_base::~ios_base(local_1d8);
  ReadBinaryFile_abi_cxx11_
            ((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&file,&tmpfile,0xffffffffffffffff);
  local_3a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_3a0 = "";
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar6 = 0x7495a5;
  file_00.m_end = (iterator)0x6f4;
  file_00.m_begin = (iterator)&local_3a8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_3b8,msg);
  local_390.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)file;
  local_390.m_message.px = (element_type *)0x0;
  local_390.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_328._M_allocated_capacity = (size_type)&local_408;
  local_408._0_8_ = "valid";
  local_408.m_message.px = (element_type *)0xf7a634;
  local_338 = false;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_3c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_3c0 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_390,(lazy_ostream *)local_340,1,0,WARN,_cVar6,(size_t)&local_3c8,0x6f4);
  boost::detail::shared_count::~shared_count(&local_390.m_message.pn);
  local_3d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_3d0 = "";
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x6f5;
  file_01.m_begin = (iterator)&local_3d8;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_3e8,
             msg_00);
  local_408.m_message.px = (element_type *)((ulong)local_408.m_message.px & 0xffffffffffffff00);
  local_408._0_8_ = &PTR__lazy_ostream_013ae088;
  local_408.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_3f0 = "";
  if (local_2c8._8_8_ == expected_text._M_string_length) {
    if (local_2c8._8_8_ == 0) {
      bVar5 = true;
    }
    else {
      iVar2 = bcmp((void *)local_2c8._0_8_,expected_text._M_dataplus._M_p,local_2c8._8_8_);
      bVar5 = iVar2 == 0;
    }
  }
  else {
    bVar5 = false;
  }
  local_2f0._M_dataplus._M_p._0_1_ = bVar5;
  local_2f0._M_string_length = 0;
  local_2f0.field_2._M_allocated_capacity = 0;
  local_358._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_358.m_message.px = (element_type *)0xf730f4;
  local_328._M_allocated_capacity = (size_type)&local_368;
  local_368 = (_Alloc_hider *)local_2c8;
  local_338 = false;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_013ae148;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_378 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_370;
  local_390.m_message.px = (element_type *)((ulong)local_390.m_message.px & 0xffffffffffffff00);
  local_390._0_8_ = &PTR__lazy_ostream_013ae148;
  local_390.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_370 = &expected_text;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_2f0,(lazy_ostream *)&local_408,1,2,REQUIRE,0xfd5ade,
             (size_t)&local_358,0x6f5,(lazy_ostream *)local_340,"expected_text",&local_390);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_2f0.field_2._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._0_8_ != local_2b8) {
    operator_delete((void *)local_2c8._0_8_,local_2b8[0]._M_allocated_capacity + 1);
  }
  ReadBinaryFile_abi_cxx11_
            ((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&file,&tmpfile,expected_text._M_string_length >> 1);
  local_418 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_410 = "";
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar6 = 0x749848;
  file_02.m_end = (iterator)0x6fa;
  file_02.m_begin = (iterator)&local_418;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_428,
             msg_01);
  local_390.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)file;
  local_390.m_message.px = (element_type *)0x0;
  local_390.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_408._0_8_ = "valid";
  local_408.m_message.px = (element_type *)0xf7a634;
  local_338 = false;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_438 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_430 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_328._M_allocated_capacity = (size_type)(lazy_ostream *)&local_408;
  boost::test_tools::tt_detail::report_assertion
            (&local_390,(lazy_ostream *)local_340,1,0,WARN,_cVar6,(size_t)&local_438,0x6fa);
  boost::detail::shared_count::~shared_count(&local_390.m_message.pn);
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x6fb;
  file_03.m_begin = (iterator)&local_448;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_458,
             msg_02);
  local_408.m_message.px = (element_type *)((ulong)local_408.m_message.px & 0xffffffffffffff00);
  local_408._0_8_ = &PTR__lazy_ostream_013ae088;
  local_408.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_3f0 = "";
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_2f0,&expected_text,0,expected_text._M_string_length >> 1);
  if (local_2c8._8_8_ == local_2f0._M_string_length) {
    if (local_2c8._8_8_ == 0) {
      bVar5 = true;
    }
    else {
      iVar2 = bcmp((void *)local_2c8._0_8_,local_2f0._M_dataplus._M_p,local_2c8._8_8_);
      bVar5 = iVar2 == 0;
    }
  }
  else {
    bVar5 = false;
  }
  local_358.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar5;
  local_358.m_message.px = (element_type *)0x0;
  local_358.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_368 = (_Alloc_hider *)0xf73098;
  local_360 = "";
  local_370 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8;
  local_338 = false;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_013ae148;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328._M_allocated_capacity = (size_type)&local_370;
  local_378 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_398;
  local_390.m_message.px = (element_type *)((ulong)local_390.m_message.px & 0xffffffffffffff00);
  local_390._0_8_ = &PTR__lazy_ostream_013ae148;
  local_390.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_398 = &local_2f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_358,(lazy_ostream *)&local_408,1,2,REQUIRE,0xfd5ade,(size_t)&local_368,0x6fb,
             (lazy_ostream *)local_340,"expected_text.substr(0, expected_text.size() / 2)",
             &local_390);
  boost::detail::shared_count::~shared_count(&local_358.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._0_8_ != local_2b8) {
    operator_delete((void *)local_2c8._0_8_,local_2b8[0]._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::path(&local_318,&tmpfolder.super_path);
  std::filesystem::__cxx11::path::_M_append(&local_318,0x12,"invalid_binary.dat");
  std::filesystem::__cxx11::path::path((path *)&file,&local_318);
  std::filesystem::__cxx11::path::~path(&local_318);
  ReadBinaryFile_abi_cxx11_
            ((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_340,(path *)&file,0xffffffffffffffff);
  local_468 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_460 = "";
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar6 = 0x749b77;
  file_04.m_end = (iterator)0x701;
  file_04.m_begin = (iterator)&local_468;
  msg_03.m_end = pvVar4;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_478,
             msg_03);
  local_408._0_8_ = CONCAT71(local_408._1_7_,local_340[0]) ^ 1;
  local_408.m_message.px = (element_type *)0x0;
  local_408.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2f0._M_dataplus._M_p = "!valid";
  local_2f0._M_string_length = 0xf7b2d5;
  local_390.m_message.px = (element_type *)((ulong)local_390.m_message.px & 0xffffffffffffff00);
  local_390._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_390.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_480 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_378 = &local_2f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_408,(lazy_ostream *)&local_390,1,0,WARN,_cVar6,(size_t)&local_488,0x701);
  boost::detail::shared_count::~shared_count(&local_408.m_message.pn);
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_490 = "";
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar6 = 0x749c35;
  file_05.m_end = (iterator)0x702;
  file_05.m_begin = (iterator)&local_498;
  msg_04.m_end = pvVar4;
  msg_04.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_4a8,
             msg_04);
  local_408.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_330 == (undefined1 *)0x0);
  local_408.m_message.px = (element_type *)0x0;
  local_408.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2f0._M_dataplus._M_p = "text.empty()";
  local_2f0._M_string_length = 0xf7b2e2;
  local_390.m_message.px = (element_type *)((ulong)local_390.m_message.px & 0xffffffffffffff00);
  local_390._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_390.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_4b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_4b0 = "";
  local_378 = &local_2f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_408,(lazy_ostream *)&local_390,1,0,WARN,_cVar6,(size_t)&local_4b8,0x702);
  boost::detail::shared_count::~shared_count(&local_408.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(uStack_337,local_338) != &local_328) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_337,local_338),local_328._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path((path *)&file);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)expected_text._M_dataplus._M_p != &expected_text.field_2) {
    operator_delete(expected_text._M_dataplus._M_p,
                    CONCAT71(expected_text.field_2._M_allocated_capacity._1_7_,
                             expected_text.field_2._M_local_buf[0]) + 1);
  }
  std::filesystem::__cxx11::path::~path(&tmpfile.super_path);
  std::filesystem::__cxx11::path::~path(&tmpfolder.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_ReadBinaryFile)
{
    fs::path tmpfolder = m_args.GetDataDirBase();
    fs::path tmpfile = tmpfolder / "read_binary.dat";
    std::string expected_text;
    for (int i = 0; i < 30; i++) {
        expected_text += "0123456789";
    }
    {
        std::ofstream file{tmpfile};
        file << expected_text;
    }
    {
        // read all contents in file
        auto [valid, text] = ReadBinaryFile(tmpfile);
        BOOST_CHECK(valid);
        BOOST_CHECK_EQUAL(text, expected_text);
    }
    {
        // read half contents in file
        auto [valid, text] = ReadBinaryFile(tmpfile, expected_text.size() / 2);
        BOOST_CHECK(valid);
        BOOST_CHECK_EQUAL(text, expected_text.substr(0, expected_text.size() / 2));
    }
    {
        // read from non-existent file
        fs::path invalid_file = tmpfolder / "invalid_binary.dat";
        auto [valid, text] = ReadBinaryFile(invalid_file);
        BOOST_CHECK(!valid);
        BOOST_CHECK(text.empty());
    }
}